

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::value_t,_toml::error_info> *
toml::detail::guess_number_type<toml::type_config>
          (result<toml::value_t,_toml::error_info> *__return_storage_ptr__,location *first,
          context<toml::type_config> *ctx)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  char_type_conflict cVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  string *psVar8;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  initializer_list<unsigned_char> cs;
  allocator<char> local_110b;
  allocator<char> local_110a;
  allocator<char> local_1109;
  string local_1108;
  region int_reg;
  location loc;
  source_location src;
  undefined1 local_fc0 [104];
  string local_f58;
  string local_f38;
  undefined1 local_f18 [32];
  string local_ef8;
  undefined1 local_ed8 [32];
  string local_eb8;
  undefined1 local_e98 [64];
  undefined1 local_e58 [64];
  undefined1 local_e18 [64];
  undefined1 local_dd8 [64];
  undefined1 local_d98 [64];
  undefined1 local_d58 [64];
  undefined1 local_d18 [32];
  string local_cf8;
  undefined1 local_cd8 [32];
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  location local_b98;
  location local_b50;
  location local_b08;
  location local_ac0;
  source_location local_a78;
  source_location local_a00;
  source_location local_988;
  source_location local_910;
  source_location local_898;
  source_location local_820;
  source_location local_7a8;
  source_location local_730;
  source_location local_6b8;
  source_location local_640;
  source_location local_5c8;
  error_info local_550;
  error_info local_4f8;
  error_info local_4a0;
  error_info local_448;
  error_info local_3f0;
  error_info local_398;
  error_info local_340;
  error_info local_2e8;
  error_info local_290;
  error_info local_238;
  error_info local_1e0;
  error_info local_188;
  error_info local_130;
  error_info local_d8;
  error_info local_80;
  
  location::location(&loc,first);
  syntax::offset_datetime((sequence *)&int_reg,&ctx->toml_spec_);
  sequence::scan((region *)&src,(sequence *)&int_reg,&loc);
  uVar2 = src._0_8_;
  region::~region((region *)&src);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &int_reg.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount);
  if (uVar2 != 0) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = offset_datetime;
    goto LAB_002f097c;
  }
  location::operator=(&loc,first);
  syntax::local_datetime((sequence *)&int_reg,&ctx->toml_spec_);
  sequence::scan((region *)&src,(sequence *)&int_reg,&loc);
  uVar2 = src._0_8_;
  region::~region((region *)&src);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &int_reg.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount);
  if (uVar2 != 0) {
    cVar3 = location::current(&loc);
    if ((cVar3 != '-') && (cVar3 != '+')) {
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ_.value = local_datetime;
      goto LAB_002f097c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bb8,"bad offset: must be [+-]HH:MM or Z",
               (allocator<char> *)local_fc0);
    syntax::time_offset((either *)&int_reg,&ctx->toml_spec_);
    location::location(&local_ac0,&loc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd8,"Hint: valid  : +09:00, -05:30\nHint: invalid: +9:00,  -5:30\n",
               (allocator<char> *)&local_1108);
    make_syntax_error<toml::detail::either>
              ((error_info *)&src,&local_bb8,(either *)&int_reg,&local_ac0,&local_bd8);
    err<toml::error_info>((failure<toml::error_info> *)&local_80,(error_info *)&src);
    result<toml::value_t,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_80);
    error_info::~error_info(&local_80);
    error_info::~error_info((error_info *)&src);
    std::__cxx11::string::~string((string *)&local_bd8);
    location::~location(&local_ac0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&int_reg.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
    psVar8 = &local_bb8;
    goto LAB_002f0356;
  }
  location::operator=(&loc,first);
  syntax::local_date((sequence *)&int_reg,&ctx->toml_spec_);
  sequence::scan((region *)&src,(sequence *)&int_reg,&loc);
  uVar2 = src._0_8_;
  region::~region((region *)&src);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &int_reg.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount);
  if (uVar2 != 0) {
    if (loc.location_ <
        (ulong)((long)((loc.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)((loc.source_.
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
      bVar4 = location::current(&loc);
      if ((bVar4 & 0xdf) == 0x54) {
        location::advance(&loc,1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_bf8,"bad time: must be HH:MM:SS.subsec",
                   (allocator<char> *)local_fc0);
        syntax::local_time((sequence *)&int_reg,&ctx->toml_spec_);
        location::location(&local_b08,&loc);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c18,
                   "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\nHint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n"
                   ,(allocator<char> *)&local_1108);
        make_syntax_error<toml::detail::sequence>
                  ((error_info *)&src,&local_bf8,(sequence *)&int_reg,&local_b08,&local_c18);
        err<toml::error_info>((failure<toml::error_info> *)&local_d8,(error_info *)&src);
        result<toml::value_t,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_d8);
        error_info::~error_info(&local_d8);
        error_info::~error_info((error_info *)&src);
        std::__cxx11::string::~string((string *)&local_c18);
        location::~location(&local_b08);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 *)&int_reg.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        psVar8 = &local_bf8;
LAB_002f0356:
        std::__cxx11::string::~string((string *)psVar8);
        goto LAB_002f097c;
      }
      if (bVar4 == 0x20) {
        location::advance(&loc,1);
        if (loc.location_ <
            (ulong)((long)((loc.source_.
                            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)((loc.source_.
                           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start)) {
          bVar4 = location::current(&loc);
          if (0x2f < bVar4) {
            bVar4 = location::current(&loc);
            if (bVar4 < 0x3a) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c38,"bad time: must be HH:MM:SS.subsec",
                         (allocator<char> *)local_fc0);
              syntax::local_time((sequence *)&int_reg,&ctx->toml_spec_);
              location::location(&local_b50,&loc);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c58,
                         "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\nHint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n"
                         ,(allocator<char> *)&local_1108);
              make_syntax_error<toml::detail::sequence>
                        ((error_info *)&src,&local_c38,(sequence *)&int_reg,&local_b50,&local_c58);
              err<toml::error_info>((failure<toml::error_info> *)&local_130,(error_info *)&src);
              result<toml::value_t,_toml::error_info>::result
                        (__return_storage_ptr__,(failure_type *)&local_130);
              error_info::~error_info(&local_130);
              error_info::~error_info((error_info *)&src);
              std::__cxx11::string::~string((string *)&local_c58);
              location::~location(&local_b50);
              std::
              vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         *)&int_reg.source_.
                            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              psVar8 = &local_c38;
              goto LAB_002f0356;
            }
          }
        }
      }
      else if ((byte)(bVar4 - 0x30) < 10) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c78,"bad datetime: missing T or space",
                   (allocator<char> *)&local_1108);
        local_fc0._0_2_ = 0x7454;
        local_fc0[2] = 0x20;
        cs._M_len = 3;
        cs._M_array = local_fc0;
        character_either::character_either((character_either *)&int_reg,cs);
        location::location(&local_b98,&loc);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c98,
                   "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\nHint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n"
                   ,&local_110b);
        make_syntax_error<toml::detail::character_either>
                  ((error_info *)&src,&local_c78,(character_either *)&int_reg,&local_b98,&local_c98)
        ;
        err<toml::error_info>((failure<toml::error_info> *)&local_188,(error_info *)&src);
        result<toml::value_t,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_188);
        error_info::~error_info(&local_188);
        error_info::~error_info((error_info *)&src);
        std::__cxx11::string::~string((string *)&local_c98);
        location::~location(&local_b98);
        CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &int_reg.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        psVar8 = &local_c78;
        goto LAB_002f0356;
      }
    }
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = local_date;
    goto LAB_002f097c;
  }
  location::operator=(&loc,first);
  syntax::local_time((sequence *)&int_reg,&ctx->toml_spec_);
  sequence::scan((region *)&src,(sequence *)&int_reg,&loc);
  uVar2 = src._0_8_;
  region::~region((region *)&src);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &int_reg.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount);
  if (uVar2 != 0) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = local_time;
    goto LAB_002f097c;
  }
  location::operator=(&loc,first);
  syntax::floating((either *)&int_reg,&ctx->toml_spec_);
  either::scan((region *)&src,(either *)&int_reg,&loc);
  uVar2 = src._0_8_;
  region::~region((region *)&src);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &int_reg.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount);
  if (uVar2 != 0) {
    if (loc.location_ <
        (ulong)((long)((loc.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)((loc.source_.
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
      cVar3 = location::current(&loc);
      if (cVar3 == '_') {
        if ((ctx->toml_spec_).ext_num_suffix == true) {
          syntax::num_suffix((sequence *)&int_reg,&ctx->toml_spec_);
          sequence::scan((region *)&src,(sequence *)&int_reg,&loc);
          region::~region((region *)&src);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)&int_reg.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          if (src._0_8_ != 0) goto LAB_002f0a80;
        }
        region::region(&int_reg,&loc);
        source_location::source_location(&src,&int_reg);
        region::~region(&int_reg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_cd8 + 0x20),"bad float: `_` must be surrounded by digits",
                   (allocator<char> *)local_fc0);
        source_location::source_location(&local_5c8,&src);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_cd8,"invalid underscore",(allocator<char> *)&local_1108);
        make_error_info<char_const(&)[105]>
                  ((error_info *)&int_reg,(toml *)(local_cd8 + 0x20),(string *)&local_5c8,
                   (source_location *)local_cd8,
                   (string *)
                   "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\nHint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"
                   ,(char (*) [105])in_R9);
        err<toml::error_info>((failure<toml::error_info> *)&local_1e0,(error_info *)&int_reg);
        result<toml::value_t,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_1e0);
        error_info::~error_info(&local_1e0);
        error_info::~error_info((error_info *)&int_reg);
        std::__cxx11::string::~string((string *)local_cd8);
        source_location::~source_location(&local_5c8);
        psVar8 = (string *)(local_cd8 + 0x20);
        goto LAB_002f12d6;
      }
    }
LAB_002f0a80:
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = floating;
    goto LAB_002f097c;
  }
  location::operator=(&loc,first);
  if ((ctx->toml_spec_).ext_hex_float == true) {
    syntax::hex_floating((sequence *)&int_reg,&ctx->toml_spec_);
    sequence::scan((region *)&src,(sequence *)&int_reg,&loc);
    uVar2 = src._0_8_;
    region::~region((region *)&src);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&int_reg.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
    if (uVar2 != 0) {
      if (loc.location_ <
          (ulong)((long)((loc.source_.
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)((loc.source_.
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_start)) {
        cVar3 = location::current(&loc);
        if (cVar3 == '_') {
          if ((ctx->toml_spec_).ext_num_suffix == true) {
            syntax::num_suffix((sequence *)&int_reg,&ctx->toml_spec_);
            sequence::scan((region *)&src,(sequence *)&int_reg,&loc);
            region::~region((region *)&src);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)&int_reg.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            if (src._0_8_ != 0) goto LAB_002f0a80;
          }
          region::region(&int_reg,&loc);
          source_location::source_location(&src,&int_reg);
          region::~region(&int_reg);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_d18 + 0x20),"bad float: `_` must be surrounded by digits",
                     (allocator<char> *)local_fc0);
          source_location::source_location(&local_640,&src);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_d18,"invalid underscore",(allocator<char> *)&local_1108);
          make_error_info<char_const(&)[105]>
                    ((error_info *)&int_reg,(toml *)(local_d18 + 0x20),(string *)&local_640,
                     (source_location *)local_d18,
                     (string *)
                     "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\nHint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"
                     ,(char (*) [105])in_R9);
          err<toml::error_info>((failure<toml::error_info> *)&local_238,(error_info *)&int_reg);
          result<toml::value_t,_toml::error_info>::result
                    (__return_storage_ptr__,(failure_type *)&local_238);
          error_info::~error_info(&local_238);
          error_info::~error_info((error_info *)&int_reg);
          std::__cxx11::string::~string((string *)local_d18);
          source_location::~source_location(&local_640);
          psVar8 = (string *)(local_d18 + 0x20);
          goto LAB_002f12d6;
        }
      }
      goto LAB_002f0a80;
    }
    location::operator=(&loc,first);
  }
  syntax::integer((either *)&src,&ctx->toml_spec_);
  either::scan(&int_reg,(either *)&src,&loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &src.first_line_);
  if (int_reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    region::~region(&int_reg);
    uVar7 = (long)((loc.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)((loc.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (loc.location_ < uVar7) {
      cVar3 = location::current(&loc);
      if (cVar3 == '.') {
        region::region(&int_reg,&loc);
        source_location::source_location(&src,&int_reg);
        region::~region(&int_reg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_ed8 + 0x20),
                   "bad float: integer part is required before decimal point",
                   (allocator<char> *)&local_1108);
        source_location::source_location(&local_988,&src);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_ed8,"missing integer part",&local_110b);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_fc0,
                   "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\nHint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"
                   ,&local_110a);
        make_error_info<std::__cxx11::string>
                  ((error_info *)&int_reg,(toml *)(local_ed8 + 0x20),(string *)&local_988,
                   (source_location *)local_ed8,(string *)local_fc0,in_R9);
        err<toml::error_info>((failure<toml::error_info> *)&local_4a0,(error_info *)&int_reg);
        result<toml::value_t,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_4a0);
        error_info::~error_info(&local_4a0);
        error_info::~error_info((error_info *)&int_reg);
        std::__cxx11::string::~string((string *)local_fc0);
        std::__cxx11::string::~string((string *)local_ed8);
        source_location::~source_location(&local_988);
        psVar8 = (string *)(local_ed8 + 0x20);
        goto LAB_002f12d6;
      }
      uVar7 = (long)((loc.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)((loc.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
    }
    if (loc.location_ < uVar7) {
      cVar3 = location::current(&loc);
      if (cVar3 == '_') {
        region::region(&int_reg,&loc);
        source_location::source_location(&src,&int_reg);
        region::~region(&int_reg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_f18 + 0x20),"bad number: `_` must be surrounded by digits",
                   (allocator<char> *)&local_1108);
        source_location::source_location(&local_a00,&src);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f18,"digits required before `_`",&local_110b);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_fc0,
                   "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
                   ,&local_110a);
        make_error_info<std::__cxx11::string>
                  ((error_info *)&int_reg,(toml *)(local_f18 + 0x20),(string *)&local_a00,
                   (source_location *)local_f18,(string *)local_fc0,in_R9);
        err<toml::error_info>((failure<toml::error_info> *)&local_4f8,(error_info *)&int_reg);
        result<toml::value_t,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_4f8);
        error_info::~error_info(&local_4f8);
        error_info::~error_info((error_info *)&int_reg);
        std::__cxx11::string::~string((string *)local_fc0);
        std::__cxx11::string::~string((string *)local_f18);
        source_location::~source_location(&local_a00);
        psVar8 = (string *)(local_f18 + 0x20);
        goto LAB_002f12d6;
      }
    }
    region::region(&int_reg,&loc);
    source_location::source_location(&src,&int_reg);
    region::~region(&int_reg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f38,"bad format: unknown value appeared",
               (allocator<char> *)local_fc0);
    source_location::source_location(&local_a78,&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f58,"here",(allocator<char> *)&local_1108);
    make_error_info<>((error_info *)&int_reg,&local_f38,&local_a78,&local_f58);
    err<toml::error_info>((failure<toml::error_info> *)&local_550,(error_info *)&int_reg);
    result<toml::value_t,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_550);
    error_info::~error_info(&local_550);
    error_info::~error_info((error_info *)&int_reg);
    std::__cxx11::string::~string((string *)&local_f58);
    source_location::~source_location(&local_a78);
    psVar8 = &local_f38;
LAB_002f12d6:
    std::__cxx11::string::~string((string *)psVar8);
    source_location::~source_location(&src);
    goto LAB_002f097c;
  }
  if ((ulong)((long)((loc.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)((loc.source_.
                     super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) <= loc.location_) goto LAB_002f0b6b;
  bVar4 = location::current(&loc);
  if (bVar4 == 0x5f) {
    if ((ctx->toml_spec_).ext_num_suffix == true) {
      syntax::num_suffix((sequence *)local_fc0,&ctx->toml_spec_);
      sequence::scan((region *)&src,(sequence *)local_fc0,&loc);
      region::~region((region *)&src);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_fc0 + 8));
      if (src._0_8_ != 0) goto LAB_002f0b6b;
    }
    if (2 < int_reg.length_) {
LAB_002f16ce:
      region::region((region *)local_fc0,&loc);
      source_location::source_location(&src,(region *)local_fc0);
      region::~region((region *)local_fc0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_d98 + 0x20),"bad integer: `_` must be surrounded by digits",
                 (allocator<char> *)&local_1108);
      source_location::source_location(&local_730,&src);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d98,"invalid underscore",&local_110b);
      make_error_info<char_const(&)[96]>
                ((error_info *)local_fc0,(toml *)(local_d98 + 0x20),(string *)&local_730,
                 (source_location *)local_d98,
                 (string *)
                 "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
                 ,(char (*) [96])in_R9);
      err<toml::error_info>((failure<toml::error_info> *)&local_2e8,(error_info *)local_fc0);
      result<toml::value_t,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_2e8);
      error_info::~error_info(&local_2e8);
      error_info::~error_info((error_info *)local_fc0);
      std::__cxx11::string::~string((string *)local_d98);
      source_location::~source_location(&local_730);
      this = (string *)(local_d98 + 0x20);
      goto LAB_002f17d0;
    }
    region::as_string_abi_cxx11_((string *)&src,&int_reg);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &src,"0");
    if (bVar5) {
LAB_002f0e84:
      std::__cxx11::string::~string((string *)&src);
    }
    else {
      region::as_string_abi_cxx11_((string *)local_fc0,&int_reg);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_fc0,"-0");
      if (bVar5) {
        std::__cxx11::string::~string((string *)local_fc0);
        goto LAB_002f0e84;
      }
      region::as_string_abi_cxx11_(&local_1108,&int_reg);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_1108,"+0");
      std::__cxx11::string::~string((string *)&local_1108);
      std::__cxx11::string::~string((string *)local_fc0);
      std::__cxx11::string::~string((string *)&src);
      if (!bVar5) goto LAB_002f16ce;
    }
    region::region((region *)local_fc0,&loc);
    source_location::source_location(&src,(region *)local_fc0);
    region::~region((region *)local_fc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_d58 + 0x20),
               "bad integer: leading zero is not allowed in decimal int",
               (allocator<char> *)&local_1108);
    source_location::source_location(&local_6b8,&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d58,"leading zero",&local_110b);
    make_error_info<char_const(&)[96]>
              ((error_info *)local_fc0,(toml *)(local_d58 + 0x20),(string *)&local_6b8,
               (source_location *)local_d58,
               (string *)
               "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
               ,(char (*) [96])in_R9);
    err<toml::error_info>((failure<toml::error_info> *)&local_290,(error_info *)local_fc0);
    result<toml::value_t,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_290);
    error_info::~error_info(&local_290);
    error_info::~error_info((error_info *)local_fc0);
    std::__cxx11::string::~string((string *)local_d58);
    source_location::~source_location(&local_6b8);
    this = (string *)(local_d58 + 0x20);
LAB_002f17d0:
    std::__cxx11::string::~string(this);
    source_location::~source_location(&src);
  }
  else if ((byte)(bVar4 - 0x30) < 10) {
    cVar3 = location::current(&loc);
    if (cVar3 == '0') {
      location::retrace(&loc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_dd8 + 0x20),"bad integer: leading zero",&local_110b);
      region::region((region *)&src,&loc);
      source_location::source_location(&local_7a8,(region *)&src);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_dd8,"leading zero is not allowed",&local_110a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1108,
                 "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
                 ,&local_1109);
      make_error_info<std::__cxx11::string>
                ((error_info *)local_fc0,(toml *)(local_dd8 + 0x20),(string *)&local_7a8,
                 (source_location *)local_dd8,&local_1108,in_R9);
      err<toml::error_info>((failure<toml::error_info> *)&local_340,(error_info *)local_fc0);
      result<toml::value_t,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_340);
      error_info::~error_info(&local_340);
      error_info::~error_info((error_info *)local_fc0);
      std::__cxx11::string::~string((string *)&local_1108);
      std::__cxx11::string::~string((string *)local_dd8);
      source_location::~source_location(&local_7a8);
      region::~region((region *)&src);
      puVar1 = local_dd8;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_e18 + 0x20),"bad integer: invalid digit after an integer",
                 &local_110b);
      region::region((region *)&src,&loc);
      source_location::source_location(&local_820,(region *)&src);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e18,"this digit is not allowed",&local_110a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1108,
                 "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\nHint: invalid: _42, 1__000, 0123\n"
                 ,&local_1109);
      make_error_info<std::__cxx11::string>
                ((error_info *)local_fc0,(toml *)(local_e18 + 0x20),(string *)&local_820,
                 (source_location *)local_e18,&local_1108,in_R9);
      err<toml::error_info>((failure<toml::error_info> *)&local_398,(error_info *)local_fc0);
      result<toml::value_t,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_398);
      error_info::~error_info(&local_398);
      error_info::~error_info((error_info *)local_fc0);
      std::__cxx11::string::~string((string *)&local_1108);
      std::__cxx11::string::~string((string *)local_e18);
      source_location::~source_location(&local_820);
      region::~region((region *)&src);
      puVar1 = local_e18;
    }
    std::__cxx11::string::~string((string *)(puVar1 + 0x20));
  }
  else {
    uVar6 = bVar4 - 0x2d;
    if (uVar6 < 0x39) {
      if ((0x100000001000002U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
        if ((0x2001UL >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_002f0b6b;
        region::region((region *)local_fc0,&loc);
        source_location::source_location(&src,(region *)local_fc0);
        region::~region((region *)local_fc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_e58 + 0x20),"bad datetime: invalid format",&local_110b);
        source_location::source_location(&local_898,&src);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_e58,"here",&local_110a);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1108,
                   "Hint: valid  : 1979-05-27T07:32:00-07:00, 1979-05-27 07:32:00.999999Z\nHint: invalid: 1979-05-27T7:32:00-7:00, 1979-05-27 7:32-00:30"
                   ,&local_1109);
        make_error_info<std::__cxx11::string>
                  ((error_info *)local_fc0,(toml *)(local_e58 + 0x20),(string *)&local_898,
                   (source_location *)local_e58,&local_1108,in_R9);
        err<toml::error_info>((failure<toml::error_info> *)&local_3f0,(error_info *)local_fc0);
        result<toml::value_t,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_3f0);
        error_info::~error_info(&local_3f0);
        error_info::~error_info((error_info *)local_fc0);
        std::__cxx11::string::~string((string *)&local_1108);
        std::__cxx11::string::~string((string *)local_e58);
        source_location::~source_location(&local_898);
        this = (string *)(local_e58 + 0x20);
      }
      else {
        region::region((region *)local_fc0,&loc);
        source_location::source_location(&src,(region *)local_fc0);
        region::~region((region *)local_fc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_e98 + 0x20),"bad float: invalid format",&local_110b);
        source_location::source_location(&local_910,&src);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_e98,"here",&local_110a);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1108,
                   "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\nHint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"
                   ,&local_1109);
        make_error_info<std::__cxx11::string>
                  ((error_info *)local_fc0,(toml *)(local_e98 + 0x20),(string *)&local_910,
                   (source_location *)local_e98,&local_1108,in_R9);
        err<toml::error_info>((failure<toml::error_info> *)&local_448,(error_info *)local_fc0);
        result<toml::value_t,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_448);
        error_info::~error_info(&local_448);
        error_info::~error_info((error_info *)local_fc0);
        std::__cxx11::string::~string((string *)&local_1108);
        std::__cxx11::string::~string((string *)local_e98);
        source_location::~source_location(&local_910);
        this = (string *)(local_e98 + 0x20);
      }
      goto LAB_002f17d0;
    }
LAB_002f0b6b:
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = integer;
  }
  region::~region(&int_reg);
LAB_002f097c:
  location::~location(&loc);
  return __return_storage_ptr__;
}

Assistant:

result<value_t, error_info>
guess_number_type(const location& first, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    location loc = first;

    if(syntax::offset_datetime(spec).scan(loc).is_ok())
    {
        return ok(value_t::offset_datetime);
    }
    loc = first;

    if(syntax::local_datetime(spec).scan(loc).is_ok())
    {
        const auto curr = loc.current();
        // if offset_datetime contains bad offset, it syntax::offset_datetime
        // fails to scan it.
        if(curr == '+' || curr == '-')
        {
            return err(make_syntax_error("bad offset: must be [+-]HH:MM or Z",
                syntax::time_offset(spec), loc, std::string(
                "Hint: valid  : +09:00, -05:30\n"
                "Hint: invalid: +9:00,  -5:30\n")));
        }
        return ok(value_t::local_datetime);
    }
    loc = first;

    if(syntax::local_date(spec).scan(loc).is_ok())
    {
        // bad time may appear after this.

        if( ! loc.eof())
        {
            const auto c = loc.current();
            if(c == 'T' || c == 't')
            {
                loc.advance();

                return err(make_syntax_error("bad time: must be HH:MM:SS.subsec",
                    syntax::local_time(spec), loc, std::string(
                    "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\n"
                    "Hint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n")));
            }
            if(c == ' ')
            {
                // A space is allowed as a delimiter between local time.
                // But there is a case where bad time follows a space.
                // - invalid: 2019-06-16 7:00:00
                // - valid  : 2019-06-16 07:00:00
                loc.advance();
                if( ! loc.eof() && ('0' <= loc.current() && loc.current() <= '9'))
                {
                    return err(make_syntax_error("bad time: must be HH:MM:SS.subsec",
                        syntax::local_time(spec), loc, std::string(
                        "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\n"
                        "Hint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n")));
                }
            }
            if('0' <= c && c <= '9')
            {
                return err(make_syntax_error("bad datetime: missing T or space",
                    character_either{'T', 't', ' '}, loc, std::string(
                    "Hint: valid  : 1979-05-27T07:32:00, 1979-05-27 07:32:00.999999\n"
                    "Hint: invalid: 1979-05-27T7:32:00, 1979-05-27 17:32\n")));
            }
        }
        return ok(value_t::local_date);
    }
    loc = first;

    if(syntax::local_time(spec).scan(loc).is_ok())
    {
        return ok(value_t::local_time);
    }
    loc = first;

    if(syntax::floating(spec).scan(loc).is_ok())
    {
        if( ! loc.eof() && loc.current() == '_')
        {
            if(spec.ext_num_suffix && syntax::num_suffix(spec).scan(loc).is_ok())
            {
                return ok(value_t::floating);
            }
            auto src = source_location(region(loc));
            return err(make_error_info(
                "bad float: `_` must be surrounded by digits",
                std::move(src), "invalid underscore",
                "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
                "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"));
        }
        return ok(value_t::floating);
    }
    loc = first;

    if(spec.ext_hex_float)
    {
        if(syntax::hex_floating(spec).scan(loc).is_ok())
        {
            if( ! loc.eof() && loc.current() == '_')
            {
                if(spec.ext_num_suffix && syntax::num_suffix(spec).scan(loc).is_ok())
                {
                    return ok(value_t::floating);
                }
                auto src = source_location(region(loc));
                return err(make_error_info(
                    "bad float: `_` must be surrounded by digits",
                    std::move(src), "invalid underscore",
                    "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
                    "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n"));
            }
            return ok(value_t::floating);
        }
        loc = first;
    }

    if(auto int_reg = syntax::integer(spec).scan(loc))
    {
        if( ! loc.eof())
        {
            const auto c = loc.current();
            if(c == '_')
            {
                if(spec.ext_num_suffix && syntax::num_suffix(spec).scan(loc).is_ok())
                {
                    return ok(value_t::integer);
                }

                if(int_reg.length() <= 2 && (int_reg.as_string() == "0" ||
                    int_reg.as_string() == "-0" || int_reg.as_string() == "+0"))
                {
                    auto src = source_location(region(loc));
                    return err(make_error_info(
                        "bad integer: leading zero is not allowed in decimal int",
                        std::move(src), "leading zero",
                        "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                        "Hint: invalid: _42, 1__000, 0123\n"));
                }
                else
                {
                    auto src = source_location(region(loc));
                    return err(make_error_info(
                        "bad integer: `_` must be surrounded by digits",
                        std::move(src), "invalid underscore",
                        "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                        "Hint: invalid: _42, 1__000, 0123\n"));
                }
            }
            if('0' <= c && c <= '9')
            {
                if(loc.current() == '0')
                {
                    loc.retrace();
                    return err(make_error_info(
                        "bad integer: leading zero",
                        source_location(region(loc)), "leading zero is not allowed",
                        std::string("Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                                    "Hint: invalid: _42, 1__000, 0123\n")
                        ));
                }
                else // invalid digits, especially in oct/bin ints.
                {
                    return err(make_error_info(
                        "bad integer: invalid digit after an integer",
                        source_location(region(loc)), "this digit is not allowed",
                        std::string("Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
                                    "Hint: invalid: _42, 1__000, 0123\n")
                        ));
                }
            }
            if(c == ':' || c == '-')
            {
                auto src = source_location(region(loc));
                return err(make_error_info("bad datetime: invalid format",
                    std::move(src), "here",
                    std::string("Hint: valid  : 1979-05-27T07:32:00-07:00, 1979-05-27 07:32:00.999999Z\n"
                                "Hint: invalid: 1979-05-27T7:32:00-7:00, 1979-05-27 7:32-00:30")
                    ));
            }
            if(c == '.' || c == 'e' || c == 'E')
            {
                auto src = source_location(region(loc));
                return err(make_error_info("bad float: invalid format",
                    std::move(src), "here", std::string(
                    "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
                    "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n")));
            }
        }
        return ok(value_t::integer);
    }
    if( ! loc.eof() && loc.current() == '.')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("bad float: integer part is required before decimal point",
            std::move(src), "missing integer part", std::string(
            "Hint: valid  : +1.0, -2e-2, 3.141_592_653_589, inf, nan\n"
            "Hint: invalid: .0, 1., _1.0, 1.0_, 1_.0, 1.0__0\n")
            ));
    }
    if( ! loc.eof() && loc.current() == '_')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("bad number: `_` must be surrounded by digits",
            std::move(src), "digits required before `_`", std::string(
            "Hint: valid  : -42, 1_000, 1_2_3_4_5, 0xC0FFEE, 0b0010, 0o755\n"
            "Hint: invalid: _42, 1__000, 0123\n")
            ));
    }

    auto src = source_location(region(loc));
    return err(make_error_info("bad format: unknown value appeared",
                std::move(src), "here"));
}